

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O3

SmallBuffer * helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,NamedPoint *val)

{
  double *vals;
  value_t vVar1;
  json_value jVar2;
  _Alloc_hider __src;
  string *val_00;
  reference pvVar3;
  undefined4 in_register_00000034;
  char *in_R8;
  pointer val_01;
  string_view pointName;
  string_view val_02;
  json json;
  complex<double> cval;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  string local_68;
  data local_48;
  data local_38;
  data local_28;
  
  if (type == HELICS_NAMED_POINT) goto switchD_00290f4f_caseD_6;
  val_01 = (pointer)val->value;
  if (NAN((double)val_01)) {
    val_02._M_str = in_R8;
    val_02._M_len = (size_t)(val->name)._M_dataplus._M_p;
    typeConvert(__return_storage_ptr__,(helics *)CONCAT44(in_register_00000034,type),
                (DataType)(val->name)._M_string_length,val_02);
    return __return_storage_ptr__;
  }
  vals = &val->value;
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    pointName._M_str = (char *)&switchD_00290f4f::switchdataD_0043ab9c;
    pointName._M_len = (size_t)(val->name)._M_dataplus._M_p;
    helicsNamedPointString_abi_cxx11_
              (&local_68,(helics *)(val->name)._M_string_length,pointName,(double)val_01);
    local_78._M_len = local_68._M_string_length;
    local_78._M_str = local_68._M_dataplus._M_p;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    break;
  case HELICS_DOUBLE:
    ValueConverter<double>::convert(__return_storage_ptr__,vals);
    break;
  case HELICS_INT:
switchD_00290f4f_caseD_2:
    local_68._M_dataplus._M_p = (pointer)(long)val_01;
    goto LAB_0029120b;
  case HELICS_COMPLEX:
    local_68._M_string_length = 0;
    local_68._M_dataplus._M_p = val_01;
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&local_68);
    break;
  case HELICS_VECTOR:
    ValueConverter<double>::convert(__return_storage_ptr__,vals,1);
    break;
  case HELICS_COMPLEX_VECTOR:
    local_68._M_string_length = 0;
    local_68._M_dataplus._M_p = val_01;
    ValueConverter<std::complex<double>_>::convert
              (__return_storage_ptr__,(complex<double> *)&local_68,1);
    break;
  case HELICS_NAMED_POINT:
    goto switchD_00290f4f_caseD_6;
  case HELICS_BOOL:
    local_68._M_string_length = 0x44ef02;
    if ((double)val_01 != 0.0) {
      local_68._M_string_length = 0x4565f8;
    }
    if (NAN((double)val_01)) {
      local_68._M_string_length = 0x4565f8;
    }
    local_68._M_string_length = local_68._M_string_length + 1;
    local_68._M_dataplus._M_p = (pointer)0x1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_68)
    ;
    break;
  case HELICS_TIME:
    local_68._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
    if ((double)val_01 <= -9223372036.854765) {
      local_68._M_dataplus._M_p = (pointer)0x8000000000000001;
    }
    else if ((double)val_01 < 9223372036.854765) {
      val_01 = (pointer)((double)val_01 * 1000000000.0 +
                        *(double *)
                         (&DAT_00414040 + (ulong)(0.0 <= (double)val_01 * 1000000000.0) * 8));
      goto switchD_00290f4f_caseD_2;
    }
LAB_0029120b:
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&local_68);
    break;
  default:
    if (type == HELICS_JSON) {
      local_78._M_len = local_78._M_len & 0xffffffffffffff00;
      local_78._M_str = (char *)0x0;
      val_00 = typeNameStringRef_abi_cxx11_(HELICS_NAMED_POINT);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val_00);
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_78,"type");
      vVar1 = (pvVar3->m_data).m_type;
      (pvVar3->m_data).m_type = local_28.m_type;
      jVar2 = (pvVar3->m_data).m_value;
      (pvVar3->m_data).m_value = local_28.m_value;
      local_28.m_type = vVar1;
      local_28.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_28);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_78,"name");
      vVar1 = (pvVar3->m_data).m_type;
      (pvVar3->m_data).m_type = local_38.m_type;
      jVar2 = (pvVar3->m_data).m_value;
      (pvVar3->m_data).m_value = local_38.m_value;
      local_38.m_type = vVar1;
      local_38.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_38);
      local_48.m_type = null;
      local_48._1_7_ = 0;
      local_48.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_48,*vals);
      pvVar3 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_78,"value");
      vVar1 = (pvVar3->m_data).m_type;
      (pvVar3->m_data).m_type = local_48.m_type;
      local_48.m_type = vVar1;
      jVar2 = (pvVar3->m_data).m_value;
      (pvVar3->m_data).m_value.object = (object_t *)local_48.m_value;
      local_48.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_48);
      fileops::generateJsonString(&local_68,(json *)&local_78,true);
      __src._M_p = local_68._M_dataplus._M_p;
      (__return_storage_ptr__->buffer)._M_elems[0x30] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x31] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x32] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x33] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x34] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x35] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x36] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x37] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x38] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x39] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x3f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x20] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x21] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x22] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x23] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x24] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x25] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x26] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x27] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x28] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x29] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x2f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x11] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x12] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x13] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x14] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x15] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x16] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x17] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x18] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x19] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1a] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1b] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1c] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1d] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1e] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0x1f] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0] = 0;
      (__return_storage_ptr__->buffer)._M_elems[1] = 0;
      (__return_storage_ptr__->buffer)._M_elems[2] = 0;
      (__return_storage_ptr__->buffer)._M_elems[3] = 0;
      (__return_storage_ptr__->buffer)._M_elems[4] = 0;
      (__return_storage_ptr__->buffer)._M_elems[5] = 0;
      (__return_storage_ptr__->buffer)._M_elems[6] = 0;
      (__return_storage_ptr__->buffer)._M_elems[7] = 0;
      (__return_storage_ptr__->buffer)._M_elems[8] = 0;
      (__return_storage_ptr__->buffer)._M_elems[9] = 0;
      (__return_storage_ptr__->buffer)._M_elems[10] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xb] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xc] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xd] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xe] = 0;
      (__return_storage_ptr__->buffer)._M_elems[0xf] = 0;
      __return_storage_ptr__->bufferSize = 0;
      __return_storage_ptr__->bufferCapacity = 0x40;
      __return_storage_ptr__->heap = (byte *)__return_storage_ptr__;
      __return_storage_ptr__->nonOwning = false;
      __return_storage_ptr__->locked = false;
      __return_storage_ptr__->usingAllocatedBuffer = false;
      __return_storage_ptr__->errorCondition = '\0';
      __return_storage_ptr__->userKey = 0;
      SmallBuffer::reserve(__return_storage_ptr__,local_68._M_string_length);
      __return_storage_ptr__->bufferSize = local_68._M_string_length;
      memcpy(__return_storage_ptr__->heap,__src._M_p,local_68._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data((data *)&local_78);
      return __return_storage_ptr__;
    }
    goto switchD_00290f4f_caseD_6;
  }
  return __return_storage_ptr__;
switchD_00290f4f_caseD_6:
  ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,val);
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, const NamedPoint& val)
{
    if (type == DataType::HELICS_NAMED_POINT) {
        return ValueConverter<NamedPoint>::convert(val);
    }
    if (std::isnan(val.value)) {
        // just convert the string
        return typeConvert(type, val.name);
    }
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(val.value);
        case DataType::HELICS_INT:
            return ValueConverter<int64_t>::convert(static_cast<int64_t>(val.value));
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(Time(val.value).getBaseTimeCode());
        case DataType::HELICS_COMPLEX:
            return ValueConverter<std::complex<double>>::convert(
                std::complex<double>(val.value, 0.0));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((val.value != 0) ? "1" : "0");
        case DataType::HELICS_NAMED_POINT:
        default:
            return ValueConverter<NamedPoint>::convert(val);
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(
                (std::isnan(val.value)) ? val.name : helicsNamedPointString(val));
        case DataType::HELICS_COMPLEX_VECTOR: {
            const std::complex<double> cval(val.value, 0.0);
            return ValueConverter<std::complex<double>>::convert(&cval, 1);
        }
        case DataType::HELICS_VECTOR:
            return ValueConverter<double>::convert(&(val.value), 1);
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_NAMED_POINT);
            json["name"] = val.name;
            json["value"] = val.value;
            return fileops::generateJsonString(json);
        }
    }
}